

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void v4dwt_interleave_v(v4dwt_t *v,float *a,int x,int nb_elts_read)

{
  int iVar1;
  uint uVar2;
  v4 *pvVar3;
  float *pfVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  pvVar3 = v->wavelet;
  iVar1 = v->cas;
  uVar2 = v->sn;
  lVar7 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  pfVar4 = a;
  for (; uVar6 * 0x20 != lVar7; lVar7 = lVar7 + 0x20) {
    memcpy((void *)((long)pvVar3 + lVar7 + (long)iVar1 * 0x10),pfVar4,(ulong)(uint)nb_elts_read << 2
          );
    pfVar4 = pfVar4 + x;
  }
  pfVar4 = a + (int)(uVar2 * x);
  uVar5 = 0;
  uVar6 = (ulong)(uint)v->dn;
  if (v->dn < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 * 0x20 != uVar5; uVar5 = uVar5 + 0x20) {
    memcpy((void *)((long)pvVar3 + uVar5 + (long)iVar1 * -0x10 + 0x10),pfVar4,
           (ulong)(uint)nb_elts_read << 2);
    pfVar4 = pfVar4 + x;
  }
  return;
}

Assistant:

static void v4dwt_interleave_v(v4dwt_t* restrict v , float* restrict a , int x, int nb_elts_read){
	v4* restrict bi = v->wavelet + v->cas;
	int i;

	for(i = 0; i < v->sn; ++i){
		memcpy(&bi[i*2], &a[i*x], nb_elts_read * sizeof(float));
	}

	a += v->sn * x;
	bi = v->wavelet + 1 - v->cas;

	for(i = 0; i < v->dn; ++i){
		memcpy(&bi[i*2], &a[i*x], nb_elts_read * sizeof(float));
	}
}